

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_scanner.hpp
# Opt level: O1

void __thiscall
duckdb::BaseScanner::Process<duckdb::ColumnCountResult>(BaseScanner *this,ColumnCountResult *result)

{
  shared_ptr<duckdb::CSVStateMachine,_true> *this_00;
  idx_t *piVar1;
  ulong uVar2;
  vector<duckdb::ColumnCount,_true> *this_01;
  idx_t iVar3;
  char cVar4;
  char cVar5;
  byte bVar6;
  CSVState CVar7;
  CSVState CVar8;
  idx_t iVar9;
  CSVStates *pCVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  CSVStateMachine *pCVar17;
  CSVBufferHandle *pCVar18;
  reference pvVar19;
  idx_t *piVar20;
  idx_t iVar21;
  ulong uVar22;
  idx_t iVar23;
  
  this_00 = &this->state_machine;
  pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  cVar4 = (pCVar17->dialect_options).state_machine_options.escape.value;
  pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  if ((((pCVar17->state_machine_options).strict_mode.value == true) &&
      (pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00),
      (pCVar17->state_machine_options).strict_mode.set_by_user == true)) &&
     (pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00),
     (pCVar17->state_machine_options).new_line.value == CARRY_ON)) {
    pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
    cVar5 = (pCVar17->state_machine_options).new_line.set_by_user;
  }
  else {
    cVar5 = '\0';
  }
  piVar1 = &(this->iterator).pos.buffer_pos;
  iVar9 = (this->iterator).pos.buffer_pos;
  if ((this->iterator).is_set == true) {
    iVar21 = (this->iterator).boundary.end_pos;
    pCVar18 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(&this->cur_buffer_handle);
    if (iVar21 <= pCVar18->actual_size) goto LAB_00d248ab;
  }
  pCVar18 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(&this->cur_buffer_handle);
  iVar21 = pCVar18->actual_size;
LAB_00d248ab:
  uVar22 = *piVar1;
  if (uVar22 < iVar21) {
    uVar2 = iVar21 - 1;
    this_01 = &result->column_counts;
    do {
      pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      iVar23 = (this->iterator).pos.buffer_pos;
      bVar6 = this->buffer_handle_ptr[iVar23];
      CVar7 = (this->states).states[1];
      (this->states).states[0] = CVar7;
      CVar8 = pCVar17->transition_array->state_machine[bVar6][CVar7];
      (this->states).states[1] = CVar8;
      if (ESCAPED_RETURN < CVar8) goto switchD_00d24930_caseD_2;
      switch(CVar8) {
      case STANDARD:
        iVar3 = iVar23 + 1;
        *piVar1 = iVar3;
        uVar22 = iVar23 + 9;
        while (uVar22 < iVar21) {
          uVar22 = *(ulong *)(this->buffer_handle_ptr + iVar3);
          pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar14 = pCVar17->transition_array->delimiter;
          pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar11 = pCVar17->transition_array->new_line;
          pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar12 = pCVar17->transition_array->carriage_return;
          pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar13 = pCVar17->transition_array->escape;
          pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar22 = (uVar22 ^ pCVar17->transition_array->comment) &
                   (uVar13 ^ uVar22) & (uVar12 ^ uVar22) & (uVar11 ^ uVar22) & (uVar14 ^ uVar22);
          if ((~(0x101010101010100 - uVar22 | uVar22) & 0x8080808080808080) != 0) break;
          iVar23 = *piVar1;
          iVar3 = iVar23 + 8;
          *piVar1 = iVar3;
          uVar22 = iVar23 + 0x10;
        }
        pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar22 = (this->iterator).pos.buffer_pos;
        while ((uVar22 < uVar2 &&
               (pCVar17->transition_array->skip_standard[(byte)this->buffer_handle_ptr[uVar22]] !=
                false))) {
          (this->iterator).pos.buffer_pos = uVar22 + 1;
          pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar22 = (this->iterator).pos.buffer_pos;
        }
        goto LAB_00d24da1;
      case DELIMITER:
        result->current_column_count = result->current_column_count + 1;
        break;
      case RECORD_SEPARATOR:
        if (CVar7 == 5) {
LAB_00d24d8d:
          this->lines_read = this->lines_read + 1;
        }
        else if (CVar7 != CARRIAGE_RETURN) {
          if (CVar7 != NOT_SET) {
            bVar16 = (result->super_ScannerResult).comment;
            bVar15 = ColumnCountResult::AddRow(result,iVar23);
            if (bVar16 == true) {
              if (result->cur_line_starts_as_comment == true) {
                pvVar19 = vector<duckdb::ColumnCount,_true>::operator[]
                                    (this_01,result->result_position - 1);
                pvVar19->is_comment = true;
              }
              else {
                pvVar19 = vector<duckdb::ColumnCount,_true>::operator[]
                                    (this_01,result->result_position - 1);
                pvVar19->is_mid_comment = true;
              }
              (result->super_ScannerResult).comment = false;
              result->cur_line_starts_as_comment = false;
            }
            if (bVar15) goto LAB_00d24dd8;
          }
          goto LAB_00d24d8d;
        }
        iVar23 = *piVar1;
        break;
      case CARRIAGE_RETURN:
        if ((NOT_SET < CVar7) || ((0x860U >> (CVar7 & 0x1f) & 1) == 0)) {
          if ((result->super_ScannerResult).comment == true) {
            bVar16 = ColumnCountResult::AddRow(result,iVar23);
            if (result->cur_line_starts_as_comment == true) {
              pvVar19 = vector<duckdb::ColumnCount,_true>::operator[]
                                  (this_01,result->result_position - 1);
              pvVar19->is_comment = true;
            }
            else {
              pvVar19 = vector<duckdb::ColumnCount,_true>::operator[]
                                  (this_01,result->result_position - 1);
              pvVar19->is_mid_comment = true;
            }
            (result->super_ScannerResult).comment = false;
            result->cur_line_starts_as_comment = false;
          }
          else {
            if (cVar5 != '\0') goto LAB_00d24bfe;
            bVar16 = ColumnCountResult::AddRow(result,iVar23);
          }
          if (bVar16) {
LAB_00d24dd8:
            iVar21 = (this->iterator).pos.buffer_pos + 1;
            (this->iterator).pos.buffer_pos = iVar21;
            this->bytes_read = iVar21 - iVar9;
            this->lines_read = this->lines_read + 1;
            return;
          }
        }
LAB_00d24bfe:
        *piVar1 = *piVar1 + 1;
        iVar23 = this->lines_read;
        piVar20 = &this->lines_read;
        goto LAB_00d24d9b;
      case QUOTED:
        if (((CVar7 == MAYBE_QUOTED) || (CVar7 == UNQUOTED)) && (cVar4 != '\0')) {
          this->ever_escaped = true;
          (result->super_ScannerResult).escaped = true;
        }
        this->ever_quoted = true;
        if ((result->super_ScannerResult).quoted == false) {
          (result->super_ScannerResult).quoted_position = iVar23;
        }
        (result->super_ScannerResult).quoted = true;
        (result->super_ScannerResult).unquoted = true;
        iVar3 = iVar23 + 1;
        *piVar1 = iVar3;
        uVar22 = iVar23 + 9;
        while (uVar22 < iVar21) {
          uVar22 = *(ulong *)(this->buffer_handle_ptr + iVar3);
          pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar14 = pCVar17->transition_array->quote;
          pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar22 = (uVar22 ^ pCVar17->transition_array->escape) & (uVar14 ^ uVar22);
          if ((~(0x101010101010100 - uVar22 | uVar22) & 0x8080808080808080) != 0) break;
          iVar23 = *piVar1;
          iVar3 = iVar23 + 8;
          *piVar1 = iVar3;
          uVar22 = iVar23 + 0x10;
        }
        pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar22 = (this->iterator).pos.buffer_pos;
        while ((uVar22 < uVar2 &&
               (pCVar17->transition_array->skip_quoted[(byte)this->buffer_handle_ptr[uVar22]] !=
                false))) {
          (this->iterator).pos.buffer_pos = uVar22 + 1;
          pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar22 = (this->iterator).pos.buffer_pos;
        }
        goto LAB_00d24da1;
      case UNQUOTED:
        if (CVar7 == MAYBE_QUOTED) {
          this->ever_escaped = true;
          (result->super_ScannerResult).escaped = true;
        }
        pCVar10 = (result->super_ScannerResult).states;
        if (((pCVar10->states[0] == UNQUOTED) && (pCVar10->states[1] == UNQUOTED)) &&
           ((((result->super_ScannerResult).state_machine)->dialect_options).state_machine_options.
            escape.value != '\0')) {
          (result->super_ScannerResult).escaped = true;
        }
        (result->super_ScannerResult).quoted = true;
        break;
      case ESCAPE:
      case UNQUOTED_ESCAPE:
      case ESCAPED_RETURN:
        (result->super_ScannerResult).escaped = true;
        this->ever_escaped = true;
        break;
      case INVALID:
        result->result_position = 0;
        result->error = true;
        (this->iterator).pos.buffer_pos = iVar23 + 1;
        this->bytes_read = (iVar23 + 1) - iVar9;
        return;
      case COMMENT:
        if (((result->super_ScannerResult).states)->states[0] != STANDARD) {
          result->cur_line_starts_as_comment = true;
        }
        (result->super_ScannerResult).comment = true;
        iVar3 = iVar23 + 1;
        *piVar1 = iVar3;
        uVar22 = iVar23 + 9;
        while (uVar22 < iVar21) {
          uVar22 = *(ulong *)(this->buffer_handle_ptr + iVar3);
          pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar14 = pCVar17->transition_array->new_line;
          pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar22 = (uVar22 ^ pCVar17->transition_array->carriage_return) & (uVar14 ^ uVar22);
          if ((~(0x101010101010100 - uVar22 | uVar22) & 0x8080808080808080) != 0) break;
          iVar23 = *piVar1;
          iVar3 = iVar23 + 8;
          *piVar1 = iVar3;
          uVar22 = iVar23 + 0x10;
        }
        pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar22 = (this->iterator).pos.buffer_pos;
        while ((uVar22 < uVar2 &&
               (pCVar17->transition_array->skip_comment[(byte)this->buffer_handle_ptr[uVar22]] !=
                false))) {
          (this->iterator).pos.buffer_pos = uVar22 + 1;
          pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar22 = (this->iterator).pos.buffer_pos;
        }
        goto LAB_00d24da1;
      }
switchD_00d24930_caseD_2:
      piVar20 = piVar1;
LAB_00d24d9b:
      *piVar20 = iVar23 + 1;
LAB_00d24da1:
      uVar22 = *piVar1;
    } while (uVar22 < iVar21);
  }
  this->bytes_read = uVar22 - iVar9;
  return;
}

Assistant:

void Process(T &result) {
		idx_t to_pos;
		const bool has_escaped_value = state_machine->dialect_options.state_machine_options.escape != '\0';
		const bool only_rn_newlines =
		    state_machine->state_machine_options.strict_mode.GetValue() &&
		    state_machine->state_machine_options.strict_mode.IsSetByUser() &&
		    state_machine->state_machine_options.new_line.GetValue() == NewLineIdentifier::CARRY_ON &&
		    state_machine->state_machine_options.new_line.IsSetByUser();
		const idx_t start_pos = iterator.pos.buffer_pos;
		if (iterator.IsBoundarySet()) {
			to_pos = iterator.GetEndPos();
			if (to_pos > cur_buffer_handle->actual_size) {
				to_pos = cur_buffer_handle->actual_size;
			}
		} else {
			to_pos = cur_buffer_handle->actual_size;
		}
		while (iterator.pos.buffer_pos < to_pos) {
			state_machine->Transition(states, buffer_handle_ptr[iterator.pos.buffer_pos]);
			switch (states.states[1]) {
			case CSVState::INVALID:
				T::InvalidState(result);
				iterator.pos.buffer_pos++;
				bytes_read = iterator.pos.buffer_pos - start_pos;
				return;
			case CSVState::RECORD_SEPARATOR:
				if (states.states[0] == CSVState::RECORD_SEPARATOR || states.states[0] == CSVState::NOT_SET) {
					if (T::EmptyLine(result, iterator.pos.buffer_pos)) {
						iterator.pos.buffer_pos++;
						bytes_read = iterator.pos.buffer_pos - start_pos;
						lines_read++;
						return;
					}
					lines_read++;

				} else if (states.states[0] != CSVState::CARRIAGE_RETURN) {
					if (T::IsCommentSet(result)) {
						if (T::UnsetComment(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					} else {
						if (T::AddRow(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					}
					lines_read++;
				}
				iterator.pos.buffer_pos++;
				break;
			case CSVState::CARRIAGE_RETURN:
				if (states.states[0] == CSVState::RECORD_SEPARATOR || states.states[0] == CSVState::NOT_SET) {
					if (T::EmptyLine(result, iterator.pos.buffer_pos)) {
						iterator.pos.buffer_pos++;
						bytes_read = iterator.pos.buffer_pos - start_pos;
						lines_read++;
						return;
					}
				} else if (states.states[0] != CSVState::CARRIAGE_RETURN) {
					if (T::IsCommentSet(result)) {
						if (T::UnsetComment(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					} else if (!only_rn_newlines) {
						if (T::AddRow(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					}
				}
				iterator.pos.buffer_pos++;
				lines_read++;
				break;
			case CSVState::DELIMITER:
				T::AddValue(result, iterator.pos.buffer_pos);
				iterator.pos.buffer_pos++;
				break;
			case CSVState::QUOTED: {
				if ((states.states[0] == CSVState::UNQUOTED || states.states[0] == CSVState::MAYBE_QUOTED) &&
				    has_escaped_value) {
					ever_escaped = true;
					T::SetEscaped(result);
				}
				ever_quoted = true;
				T::SetQuoted(result, iterator.pos.buffer_pos);
				iterator.pos.buffer_pos++;
				while (iterator.pos.buffer_pos + 8 < to_pos) {
					const uint64_t value =
					    Load<uint64_t>(reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[iterator.pos.buffer_pos]));
					if (ContainsZeroByte((value ^ state_machine->transition_array.quote) &
					                     (value ^ state_machine->transition_array.escape))) {
						break;
					}
					iterator.pos.buffer_pos += 8;
				}

				while (state_machine->transition_array
				           .skip_quoted[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
				       iterator.pos.buffer_pos < to_pos - 1) {
					iterator.pos.buffer_pos++;
				}
			} break;
			case CSVState::UNQUOTED: {
				if (states.states[0] == CSVState::MAYBE_QUOTED) {
					ever_escaped = true;
					T::SetEscaped(result);
				}
				T::SetUnquoted(result);
				iterator.pos.buffer_pos++;
				break;
			}
			case CSVState::ESCAPE:
			case CSVState::UNQUOTED_ESCAPE:
			case CSVState::ESCAPED_RETURN:
				T::SetEscaped(result);
				ever_escaped = true;
				iterator.pos.buffer_pos++;
				break;
			case CSVState::STANDARD: {
				iterator.pos.buffer_pos++;
				while (iterator.pos.buffer_pos + 8 < to_pos) {
					uint64_t value =
					    Load<uint64_t>(reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[iterator.pos.buffer_pos]));
					if (ContainsZeroByte((value ^ state_machine->transition_array.delimiter) &
					                     (value ^ state_machine->transition_array.new_line) &
					                     (value ^ state_machine->transition_array.carriage_return) &
					                     (value ^ state_machine->transition_array.escape) &
					                     (value ^ state_machine->transition_array.comment))) {
						break;
					}
					iterator.pos.buffer_pos += 8;
				}
				while (state_machine->transition_array
				           .skip_standard[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
				       iterator.pos.buffer_pos < to_pos - 1) {
					iterator.pos.buffer_pos++;
				}
				break;
			}
			case CSVState::QUOTED_NEW_LINE:
				T::QuotedNewLine(result);
				iterator.pos.buffer_pos++;
				break;
			case CSVState::COMMENT: {
				T::SetComment(result, iterator.pos.buffer_pos);
				iterator.pos.buffer_pos++;
				while (iterator.pos.buffer_pos + 8 < to_pos) {
					const uint64_t value =
					    Load<uint64_t>(reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[iterator.pos.buffer_pos]));
					if (ContainsZeroByte((value ^ state_machine->transition_array.new_line) &
					                     (value ^ state_machine->transition_array.carriage_return))) {
						break;
					}
					iterator.pos.buffer_pos += 8;
				}
				while (state_machine->transition_array
				           .skip_comment[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
				       iterator.pos.buffer_pos < to_pos - 1) {
					iterator.pos.buffer_pos++;
				}
				break;
			}
			default:
				iterator.pos.buffer_pos++;
				break;
			}
		}
		bytes_read = iterator.pos.buffer_pos - start_pos;
	}